

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# streamer.cpp
# Opt level: O2

void __thiscall streamer::Streamer::cleanup(Streamer *this,EVP_PKEY_CTX *ctx)

{
  AVFormatContext *pAVar1;
  
  if (this->out_codec_ctx != (AVCodecContext *)0x0) {
    avcodec_close();
    avcodec_free_context(&this->out_codec_ctx);
  }
  pAVar1 = this->format_ctx;
  if (pAVar1 != (AVFormatContext *)0x0) {
    if (pAVar1->pb != (AVIOContext *)0x0) {
      avio_close(pAVar1->pb);
      pAVar1 = this->format_ctx;
    }
    avformat_free_context(pAVar1);
    this->format_ctx = (AVFormatContext *)0x0;
  }
  return;
}

Assistant:

void Streamer::cleanup()
{
    if(out_codec_ctx) {
        avcodec_close(out_codec_ctx);
        avcodec_free_context(&out_codec_ctx);
    }

    if(format_ctx) {
        if(format_ctx->pb) {
            avio_close(format_ctx->pb);
        }
        avformat_free_context(format_ctx);
        format_ctx = nullptr;
    }
}